

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream_test.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int tmp;
  int ret;
  int local_8;
  
  local_8 = 0;
  iVar1 = simple_test();
  if (iVar1 != 0) {
    printf("simple_test: failed!\n");
    local_8 = iVar1;
  }
  iVar1 = test_30();
  if (iVar1 != 0) {
    printf("test_30: failed!\n");
    local_8 = iVar1;
  }
  iVar1 = test_multiple_30();
  if (iVar1 != 0) {
    printf("test_multiple_30: failed!\n");
    local_8 = iVar1;
  }
  return local_8;
}

Assistant:

int main(void) {
  int ret = 0;

  int tmp = simple_test();
  if (tmp) {
    printf("simple_test: failed!\n");
    ret = tmp;
  }

  tmp = test_30();
  if (tmp) {
    printf("test_30: failed!\n");
    ret = tmp;
  }

  tmp = test_multiple_30();
  if (tmp) {
    printf("test_multiple_30: failed!\n");
    ret = tmp;
  }

  return ret;
}